

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

void __thiscall deqp::gles3::Performance::ShaderCompilerCase::draw(ShaderCompilerCase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined1 local_1c [4];
  long lStack_18;
  deUint32 pixel;
  Functions *gl;
  ShaderCompilerCase *this_local;
  
  gl = (Functions *)this;
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lStack_18 + 0x188))(0x4500);
  (**(code **)(lStack_18 + 0x568))(4,6,0x1401,"");
  (**(code **)(lStack_18 + 0x1220))(0,0,1,1,0x1908,0x1401,local_1c);
  return;
}

Assistant:

void ShaderCompilerCase::draw (void) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	static const deUint8 indices[] =
	{
		0, 1, 2,
		2, 1, 3
	};

	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_BYTE, indices);

	// \note Read one pixel to force compilation.
	deUint32 pixel;
	gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &pixel);
}